

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_utils.hpp
# Opt level: O2

bool __thiscall
graph_utils::
Dsu<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_graph::HashTableBased>
::Unite(Dsu<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_graph::HashTableBased>
        *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u,
       basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  long lVar1;
  __type _Var2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> u_rep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v_rep;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_98;
  bool local_78;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_70;
  bool local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  Find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
       )&local_70,this,u);
  if (local_50 == true) {
    Find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_98,this,v);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_98);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_70);
    if (local_78 != false) {
      Find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&local_70,this,u);
      local_98._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_98._M_value + 0x10);
      lVar1 = (long)&local_70._M_value + 0x10;
      if (local_70._M_value._M_dataplus._M_p == (_Alloc_hider)lVar1) {
        local_98._24_8_ = local_70._24_8_;
      }
      else {
        local_98._M_value._M_dataplus._M_p = local_70._M_value._M_dataplus._M_p;
      }
      local_98._M_value._M_string_length = local_70._M_value._M_string_length;
      local_70._M_value._M_string_length = 0;
      local_70._16_1_ = 0;
      local_70._M_value._M_dataplus._M_p = (_Alloc_hider)lVar1;
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70);
      Find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&local_70,this,v);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      if (local_70._M_value._M_dataplus._M_p == (_Alloc_hider)lVar1) {
        local_48.field_2._8_8_ = local_70._24_8_;
      }
      else {
        local_48._M_dataplus._M_p = (pointer)local_70._M_value._M_dataplus._M_p;
      }
      local_48.field_2._M_allocated_capacity._1_7_ = local_70._17_7_;
      local_48.field_2._M_local_buf[0] = local_70._16_1_;
      local_48._M_string_length = local_70._M_value._M_string_length;
      local_70._M_value._M_string_length = 0;
      local_70._16_1_ = 0;
      local_70._M_value._M_dataplus._M_p = (_Alloc_hider)lVar1;
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_98,&local_48);
      if (!_Var2) {
        iVar3 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->size_)._M_h,(key_type *)&local_98);
        iVar4 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->size_)._M_h,&local_48);
        if (*(ulong *)((long)iVar3.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                             ._M_cur + 0x28) <
            *(ulong *)((long)iVar4.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                             ._M_cur + 0x28)) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                     &local_48);
        }
        iVar5 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)this,&local_48);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)iVar5.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                          ._M_cur + 0x28),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
        *(long *)((long)iVar3.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                        ._M_cur + 0x28) =
             *(long *)((long)iVar3.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                             ._M_cur + 0x28) +
             *(long *)((long)iVar4.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                             ._M_cur + 0x28);
      }
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_98);
      return !_Var2;
    }
  }
  else {
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_70);
  }
  return false;
}

Assistant:

bool Unite(const Type& u, const Type& v) {
    if (!Find(u) || !Find(v))
      return false;
    Type u_rep = *Find(u);
    Type v_rep = *Find(v);
    if (!TypeEqual(u_rep, v_rep)) {
      auto u_rep_size_it = size_.find(u_rep);
      auto v_rep_size_it = size_.find(v_rep);
      if (u_rep_size_it->second < v_rep_size_it->second)
        std::swap(u_rep, v_rep);
      parent_.find(v_rep)->second = u_rep;
      u_rep_size_it->second += v_rep_size_it->second;
      return true;
    }
    return false;
  }